

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_ext_gstate.c
# Opt level: O0

HPDF_STATUS HPDF_ExtGState_SetAlphaFill(HPDF_ExtGState ext_gstate,HPDF_REAL value)

{
  HPDF_STATUS ret;
  HPDF_REAL value_local;
  HPDF_ExtGState ext_gstate_local;
  
  ext_gstate_local = (HPDF_ExtGState)ExtGState_Check(ext_gstate);
  if (ext_gstate_local == (HPDF_ExtGState)0x0) {
    if ((value < 0.0) || (1.0 < value)) {
      ext_gstate_local = (HPDF_ExtGState)HPDF_RaiseError(ext_gstate->error,0x1080,0);
    }
    else {
      ext_gstate_local = (HPDF_ExtGState)HPDF_Dict_AddReal(ext_gstate,"ca",value);
    }
  }
  return (HPDF_STATUS)ext_gstate_local;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_ExtGState_SetAlphaFill  (HPDF_ExtGState   ext_gstate,
                              HPDF_REAL        value)
{
    HPDF_STATUS ret = ExtGState_Check (ext_gstate);
    
    if (ret != HPDF_OK)
        return ret;

    if (value < 0 || value > 1.0f)
        return HPDF_RaiseError (ext_gstate->error, 
                HPDF_EXT_GSTATE_OUT_OF_RANGE, 0);

    return HPDF_Dict_AddReal (ext_gstate, "ca", value);
}